

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.c
# Opt level: O2

int wally_tx_get_total_output_satoshi(wally_tx *tx,uint64_t *value_out)

{
  _Bool _Var1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  
  if (value_out != (uint64_t *)0x0) {
    *value_out = 0;
  }
  _Var1 = is_valid_tx(tx);
  iVar2 = -2;
  if (_Var1 && value_out != (uint64_t *)0x0) {
    lVar3 = 0;
    for (uVar4 = 0; uVar4 < tx->num_outputs; uVar4 = uVar4 + 1) {
      uVar5 = *(ulong *)((long)&tx->outputs->satoshi + lVar3);
      if (((2100000000000000 < uVar5) || (uVar5 = uVar5 + *value_out, uVar5 < *value_out)) ||
         (2100000000000000 < uVar5)) {
        *value_out = 0;
        return -2;
      }
      *value_out = uVar5;
      lVar3 = lVar3 + 0x70;
    }
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int wally_tx_get_total_output_satoshi(const struct wally_tx *tx, uint64_t *value_out)
{
    size_t i;
    if (value_out)
        *value_out = 0;

    if (!is_valid_tx(tx) || !value_out)
        return WALLY_EINVAL;

    for (i = 0; i < tx->num_outputs; ++i) {
        uint64_t v = *value_out + tx->outputs[i].satoshi;

        if (tx->outputs[i].satoshi > WALLY_SATOSHI_MAX ||
            v < *value_out || v > WALLY_SATOSHI_MAX) {
            /* Overflow or too many satoshi in outputs */
            *value_out = 0;
            return WALLY_EINVAL;
        }
        *value_out = v;
    }

    return WALLY_OK;
}